

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

internal_exr_unpack_fn
internal_exr_match_decode
          (exr_decode_pipeline_t *decode,int isdeep,int chanstofill,int chanstounpack,int sametype,
          int sameouttype,int samebpc,int sameoutbpc,int hassampling,int hastypechange,
          int sameoutinc,int simpinterleave,int simpinterleaverev,int simplineoff)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000020;
  int in_stack_00000028;
  code *local_8;
  
  if (internal_exr_match_decode::init_cpu_check != 0) {
    choose_half_to_float_impl();
    LOCK();
    internal_exr_match_decode::init_cpu_check = 0;
    UNLOCK();
  }
  if (in_ESI != 0) {
    if ((*(ushort *)(in_RDI + 0x12) & 2) != 0) {
      local_8 = generic_unpack_deep_pointers;
      return local_8;
    }
    local_8 = generic_unpack_deep;
    return local_8;
  }
  if (0 < in_stack_00000020) {
    if ((in_R8D == 1) && (in_R9D == 2)) {
      if (0 < samebpc) {
        if (*(short *)(in_RDI + 0x10) == 4) {
          local_8 = unpack_half_to_float_4chan_interleave;
          return local_8;
        }
        if (*(short *)(in_RDI + 0x10) == 3) {
          local_8 = unpack_half_to_float_3chan_interleave;
          return local_8;
        }
      }
      if (0 < sameoutbpc) {
        if (*(short *)(in_RDI + 0x10) == 4) {
          local_8 = unpack_half_to_float_4chan_interleave_rev;
          return local_8;
        }
        if (*(short *)(in_RDI + 0x10) == 3) {
          local_8 = unpack_half_to_float_3chan_interleave_rev;
          return local_8;
        }
      }
      if (in_stack_00000028 == 4) {
        if (*(short *)(in_RDI + 0x10) == 4) {
          local_8 = unpack_half_to_float_4chan_planar;
          return local_8;
        }
        if (*(short *)(in_RDI + 0x10) == 3) {
          local_8 = unpack_half_to_float_3chan_planar;
          return local_8;
        }
      }
    }
    local_8 = generic_unpack;
    return local_8;
  }
  if (((((int)decode != 0) || (in_EDX != *(short *)(in_RDI + 0x10))) || (sametype < 1)) ||
     (chanstofill < 1)) {
    local_8 = generic_unpack;
    return local_8;
  }
  if (sametype != 2) {
    if (sametype == 4) {
      local_8 = unpack_32bit;
      return local_8;
    }
    local_8 = generic_unpack;
    return local_8;
  }
  if (0 < samebpc) {
    if (*(short *)(in_RDI + 0x10) == 4) {
      local_8 = unpack_16bit_4chan_interleave;
      return local_8;
    }
    if (*(short *)(in_RDI + 0x10) == 3) {
      local_8 = unpack_16bit_3chan_interleave;
      return local_8;
    }
  }
  if (0 < sameoutbpc) {
    if (*(short *)(in_RDI + 0x10) == 4) {
      local_8 = unpack_16bit_4chan_interleave_rev;
      return local_8;
    }
    if (*(short *)(in_RDI + 0x10) == 3) {
      local_8 = unpack_16bit_3chan_interleave_rev;
      return local_8;
    }
  }
  if (in_stack_00000028 == 2) {
    if (*(short *)(in_RDI + 0x10) == 4) {
      local_8 = unpack_16bit_4chan_planar;
      return local_8;
    }
    if (*(short *)(in_RDI + 0x10) == 3) {
      local_8 = unpack_16bit_3chan_planar;
      return local_8;
    }
  }
  if (*(short *)(in_RDI + 0x10) == 4) {
    local_8 = unpack_16bit_4chan;
    return local_8;
  }
  if (*(short *)(in_RDI + 0x10) == 3) {
    local_8 = unpack_16bit_3chan;
    return local_8;
  }
  local_8 = unpack_16bit;
  return local_8;
}

Assistant:

internal_exr_unpack_fn
internal_exr_match_decode (
    exr_decode_pipeline_t* decode,
    int                    isdeep,
    int                    chanstofill,
    int                    chanstounpack,
    int                    sametype,
    int                    sameouttype,
    int                    samebpc,
    int                    sameoutbpc,
    int                    hassampling,
    int                    hastypechange,
    int                    sameoutinc,
    int                    simpinterleave,
    int                    simpinterleaverev,
    int                    simplineoff)
{
#ifdef EXR_HAS_STD_ATOMICS
    static atomic_int init_cpu_check = 1;
#else
    static int init_cpu_check = 1;
#endif
    if (init_cpu_check)
    {
        choose_half_to_float_impl ();
        init_cpu_check = 0;
    }

    if (isdeep)
    {
        if ((decode->decode_flags & EXR_DECODE_NON_IMAGE_DATA_AS_POINTERS))
            return &generic_unpack_deep_pointers;
        return &generic_unpack_deep;
    }

    if (hastypechange > 0)
    {
        /* other optimizations would not be difficult, but this will
         * be the common one (where on encode / pack we want to do the
         * opposite) */
        if (sametype == (int) EXR_PIXEL_HALF &&
            sameouttype == (int) EXR_PIXEL_FLOAT)
        {
            if (simpinterleave > 0)
            {
                if (decode->channel_count == 4)
                    return &unpack_half_to_float_4chan_interleave;
                if (decode->channel_count == 3)
                    return &unpack_half_to_float_3chan_interleave;
            }

            if (simpinterleaverev > 0)
            {
                if (decode->channel_count == 4)
                    return &unpack_half_to_float_4chan_interleave_rev;
                if (decode->channel_count == 3)
                    return &unpack_half_to_float_3chan_interleave_rev;
            }

            if (sameoutinc == 4)
            {
                if (decode->channel_count == 4)
                    return &unpack_half_to_float_4chan_planar;
                if (decode->channel_count == 3)
                    return &unpack_half_to_float_3chan_planar;
            }
        }

        return &generic_unpack;
    }

    if (hassampling || chanstofill != decode->channel_count || samebpc <= 0 ||
        sameoutbpc <= 0)
        return &generic_unpack;

    (void) chanstounpack;
    (void) simplineoff;

    if (samebpc == 2)
    {
        if (simpinterleave > 0)
        {
            if (decode->channel_count == 4)
                return &unpack_16bit_4chan_interleave;
            if (decode->channel_count == 3)
                return &unpack_16bit_3chan_interleave;
        }

        if (simpinterleaverev > 0)
        {
            if (decode->channel_count == 4)
                return &unpack_16bit_4chan_interleave_rev;
            if (decode->channel_count == 3)
                return &unpack_16bit_3chan_interleave_rev;
        }

        if (sameoutinc == 2)
        {
            if (decode->channel_count == 4) return &unpack_16bit_4chan_planar;
            if (decode->channel_count == 3) return &unpack_16bit_3chan_planar;
        }

        if (decode->channel_count == 4) return &unpack_16bit_4chan;
        if (decode->channel_count == 3) return &unpack_16bit_3chan;

        return &unpack_16bit;
    }

    if (samebpc == 4)
    {
        //if (decode->channel_count == 4) return &unpack_32bit_4chan;
        //if (decode->channel_count == 3) return &unpack_32bit_3chan;
        return &unpack_32bit;
    }

    return &generic_unpack;
}